

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall application::Chat::cleanInput(Chat *this)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  uint uVar4;
  uint uVar5;
  int j;
  int iVar6;
  Chat *this_00;
  bool bVar7;
  
  uVar4 = getConsoleWidth(this);
  iVar1 = this->promptLastLine_;
  sVar3 = (this->input_)._M_string_length;
  iVar2 = this->promptLines_;
  for (iVar6 = 0; iVar6 < (int)((((long)iVar1 + sVar3) - 1) / (ulong)uVar4) + iVar2;
      iVar6 = iVar6 + 1) {
    std::operator<<((wostream *)&std::wcout,"\r");
    uVar5 = uVar4;
    while( true ) {
      this_00 = (Chat *)&std::wcout;
      bVar7 = uVar5 == 0;
      uVar5 = uVar5 - 1;
      if (bVar7) break;
      std::operator<<((wostream *)&std::wcout," ");
    }
    std::operator<<((wostream *)&std::wcout,"\r");
    if (iVar6 != this->promptLines_ + -1) {
      moveCursor(this_00,0,1);
    }
  }
  return;
}

Assistant:

void Chat::cleanInput()
{
	int consoleWidth = getConsoleWidth(),
		lines = promptLines_ + (promptLastLine_ + input_.size() - 1) / consoleWidth;

	for (int j = 0; j < lines; j++)
	{
		std::wcout << "\r";
		for (int i = 0; i < consoleWidth; i++)
			std::wcout << " ";
		std::wcout << "\r";
		if (j != promptLines_ - 1)
		{
#ifdef _WIN32
			moveCursor(0, 2);
#else
			moveCursor(0, 1);
#endif
		}
	}
#ifdef _WIN32
	moveCursor(0, 1);
#endif
}